

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtShapeHull.cpp
# Opt level: O1

void __thiscall cbtShapeHull::~cbtShapeHull(cbtShapeHull *this)

{
  uint *ptr;
  cbtVector3 *ptr_00;
  
  ptr = (this->m_indices).m_data;
  if (ptr != (uint *)0x0) {
    if ((this->m_indices).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_indices).m_data = (uint *)0x0;
  }
  (this->m_indices).m_ownsMemory = true;
  (this->m_indices).m_data = (uint *)0x0;
  (this->m_indices).m_size = 0;
  (this->m_indices).m_capacity = 0;
  ptr_00 = (this->m_vertices).m_data;
  if (ptr_00 != (cbtVector3 *)0x0) {
    if ((this->m_vertices).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_00);
    }
    (this->m_vertices).m_data = (cbtVector3 *)0x0;
  }
  (this->m_vertices).m_ownsMemory = true;
  (this->m_vertices).m_data = (cbtVector3 *)0x0;
  (this->m_vertices).m_size = 0;
  (this->m_vertices).m_capacity = 0;
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&this->m_indices);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&this->m_vertices);
  return;
}

Assistant:

cbtShapeHull::~cbtShapeHull()
{
	m_indices.clear();
	m_vertices.clear();
}